

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O3

ktx_uint32_t ktxTexture2_calcRequiredLevelAlignment(ktxTexture2 *This)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = 1;
  if ((This->supercompressionScheme == KTX_SS_BEGIN_RANGE) &&
     (uVar4 = (This->_protected->_formatSize).blockSizeInBits, uVar2 = uVar4 >> 3,
     (uVar4 & 0x18) != 0)) {
    uVar1 = 4;
    uVar4 = uVar2;
    do {
      uVar3 = uVar4;
      uVar4 = (uint)(uVar1 % (ulong)uVar3);
      uVar1 = (ulong)uVar3;
    } while (uVar4 != 0);
    uVar2 = (uVar2 << 2) / uVar3;
  }
  return uVar2;
}

Assistant:

ktx_uint32_t
 ktxTexture2_calcRequiredLevelAlignment(ktxTexture2* This)
 {
    ktx_uint32_t alignment;
    if (This->supercompressionScheme != KTX_SS_NONE)
        alignment = 1;
    else
        alignment = lcm4(This->_protected->_formatSize.blockSizeInBits / 8);
    return alignment;
 }